

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void mc_momentum_derive(gc_twist *xd,mc_momentum *p,mc_wrench *r)

{
  vector3 vxf;
  vector3 wxn;
  double local_58 [3];
  double local_40 [3];
  
  la_dcross_o((double *)xd->angular_velocity,1,(double *)p->angular_momentum,1,local_40,1);
  la_dcross_o((double *)xd->linear_velocity,1,(double *)p->linear_momentum,1,local_58,1);
  la_daxpy_oe(3,1.0,local_40,1,local_58,1,(double *)r->torque,1);
  la_dcross_o((double *)xd->angular_velocity,1,(double *)p->linear_momentum,1,(double *)r->force,1);
  return;
}

Assistant:

void mc_momentum_derive(
        const struct gc_twist *xd,
        const struct mc_momentum *p,
        struct mc_wrench *r)
{
    // w x n
    struct vector3 wxn;
    la_dcross_o(
            (double *)xd->angular_velocity, 1,
            (double *)p->angular_momentum, 1,
            (double *)&wxn, 1);

    // v x f
    struct vector3 vxf;
    la_dcross_o(
            (double *)xd->linear_velocity, 1,
            (double *)p->linear_momentum, 1,
            (double *)&vxf, 1);

    // n' = w x n + v x f
    la_daxpy_oe(3,
            1.0, (double *)&wxn, 1,
            (double *)&vxf, 1,
            (double *)r->torque, 1);

    // f' = w x f
    la_dcross_o(
            (double *)xd->angular_velocity, 1,
            (double *)p->linear_momentum, 1,
            (double *)r->force, 1);
}